

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall
doctest::detail::MultiLaneAtomic<int>::load(MultiLaneAtomic<int> *this,memory_order order)

{
  CacheLineAlignedAtomic *c;
  CacheLineAlignedAtomic *__end0;
  CacheLineAlignedAtomic *__begin0;
  CacheLineAlignedAtomic (*__range3) [32];
  int result;
  memory_order order_local;
  MultiLaneAtomic<int> *this_local;
  memory_order __b;
  
  __range3._0_4_ = 0;
  for (__end0 = this->m_atomics; __end0 != this[1].m_atomics; __end0 = __end0 + 1) {
    std::operator&(order,__memory_order_mask);
    if (order - memory_order_consume < 2) {
      this_local._4_4_ = (__end0->atomic).super___atomic_base<int>._M_i;
    }
    else if (order == memory_order_seq_cst) {
      this_local._4_4_ = (__end0->atomic).super___atomic_base<int>._M_i;
    }
    else {
      this_local._4_4_ = (__end0->atomic).super___atomic_base<int>._M_i;
    }
    __range3._0_4_ = this_local._4_4_ + (int)__range3;
  }
  return (int)__range3;
}

Assistant:

T load(std::memory_order order = std::memory_order_seq_cst) const DOCTEST_NOEXCEPT {
            auto result = T();
            for(auto const& c : m_atomics) {
                result += c.atomic.load(order);
            }
            return result;
        }